

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)

{
  ImGuiContext *ctx_00;
  bool bVar1;
  ImGuiDockNode *this;
  ImGuiDockNode *node;
  ImGuiContext *ctx;
  ImGuiID node_id_local;
  
  ctx_00 = GImGui;
  this = DockContextFindNodeByID(GImGui,node_id);
  if (this != (ImGuiDockNode *)0x0) {
    DockBuilderRemoveNodeDockedWindows(node_id,true);
    DockBuilderRemoveNodeChildNodes(node_id);
    bVar1 = ImGuiDockNode::IsCentralNode(this);
    if ((bVar1) && (this->ParentNode != (ImGuiDockNode *)0x0)) {
      this->ParentNode->LocalFlags = this->ParentNode->LocalFlags | 0x800;
    }
    DockContextRemoveNode(ctx_00,this,true);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    DockBuilderRemoveNodeDockedWindows(node_id, true);
    DockBuilderRemoveNodeChildNodes(node_id);
    if (node->IsCentralNode() && node->ParentNode)
        node->ParentNode->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    DockContextRemoveNode(ctx, node, true);
}